

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockParameterTest_calledWithoutParameters_TestShell::createTest
          (TEST_MockParameterTest_calledWithoutParameters_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x214);
  TEST_MockParameterTest_calledWithoutParameters_Test::
  TEST_MockParameterTest_calledWithoutParameters_Test
            ((TEST_MockParameterTest_calledWithoutParameters_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, calledWithoutParameters)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}